

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckRules.cpp
# Opt level: O0

bool __thiscall
GrcManager::CompatibleWithVersion
          (GrcManager *this,int fxdVersion,int *pfxdSilfNeeded,int *pfxdCpilrNeeded,
          bool *pfFixPassConstraints)

{
  int iVar1;
  int *piVar2;
  size_type_conflict sVar3;
  int *in_RCX;
  bool *in_RDX;
  int in_ESI;
  int *in_RDI;
  undefined1 *in_R8;
  GdlRenderer *unaff_retaddr;
  bool fRet;
  bool local_51;
  int local_40 [4];
  undefined1 *local_30;
  int *local_28;
  undefined4 in_stack_ffffffffffffffe8;
  int *pfxdSilfNeeded_00;
  int in_stack_fffffffffffffffc;
  
  *(int *)in_RDX = in_ESI;
  if (in_ESI < 0x50000) {
    local_30 = in_R8;
    local_28 = in_RCX;
    pfxdSilfNeeded_00 = in_RDI;
    if ((*(byte *)(in_RDI + 0x1e) & 1) == 0) {
      local_40[3] = 0x20000;
      piVar2 = std::max<int>(local_40 + 3,(int *)in_RDX);
      *(int *)in_RDX = *piVar2;
      local_40[2] = 0x20000;
      piVar2 = std::max<int>(local_40 + 2,local_28);
      *local_28 = *piVar2;
    }
    sVar3 = std::vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>::size
                      ((vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *)
                       (in_RDI + 0x92));
    if (0xff < sVar3) {
      local_40[1] = 0x30000;
      piVar2 = std::max<int>(local_40 + 1,(int *)in_RDX);
      *(int *)in_RDX = *piVar2;
      local_40[0] = 0x30000;
      piVar2 = std::max<int>(local_40,local_28);
      *local_28 = *piVar2;
    }
    if (in_ESI < *(int *)in_RDX) {
      *local_30 = 0;
    }
    iVar1 = *(int *)in_RDX;
    local_51 = GdlRenderer::CompatibleWithVersion
                         (unaff_retaddr,in_stack_fffffffffffffffc,pfxdSilfNeeded_00,
                          (int *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX);
    local_51 = local_51 && iVar1 <= in_ESI;
  }
  else {
    local_51 = true;
  }
  return local_51;
}

Assistant:

bool GrcManager::CompatibleWithVersion(int fxdVersion, int * pfxdSilfNeeded,
	int * pfxdCpilrNeeded, bool * pfFixPassConstraints)
{
	*pfxdSilfNeeded = fxdVersion;

	if (fxdVersion >= kfxdMaxSilfVersion)
		return true;

	if (!m_fBasicJust)
	{
		// We need version 2.0 for basic justification.
		*pfxdSilfNeeded = max(0x00020000, *pfxdSilfNeeded);
		*pfxdCpilrNeeded = max(0x00020000, *pfxdCpilrNeeded);
	}

	if (m_vpglfcReplcmtClasses.size() >= kMaxReplcmtClassesV1_2)
	{
		// For a large set of replacement classes, we need 3.0.
		*pfxdSilfNeeded = max(0x00030000, *pfxdSilfNeeded);
		*pfxdCpilrNeeded = max(0x00030000, *pfxdCpilrNeeded);
	}

	// For now, the Glat table version does not affect the other tables.
	//if (m_vpsymGlyphAttrs.size() >= kMaxGlyphAttrsGlat1)
	//{
	//	// For a large number of glyph attributes, we need 3.0.
	//	*pfxdNeeded = max(0x00030000, *pfxdNeeded);
	//}

	if (*pfxdSilfNeeded > fxdVersion)
		*pfFixPassConstraints = false;

	bool fRet = (*pfxdSilfNeeded <= fxdVersion);

	fRet = (m_prndr->CompatibleWithVersion(fxdVersion, pfxdSilfNeeded, pfxdCpilrNeeded,
				pfFixPassConstraints) 
		&& fRet);

	return fRet;
}